

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltools.hh
# Opt level: O1

int anon_unknown.dwarf_18535::getAttribute<int>(xmlNodePtr type,char *att_name)

{
  int iVar1;
  bool bVar2;
  char *in_RCX;
  i_interpreter_type i_interpreter;
  int local_54;
  undefined **local_50;
  type_info_t *local_48;
  type_info_t *local_40;
  string local_38;
  lexical_ostream_limited_src<char,_std::char_traits<char>_> local_18;
  
  (anonymous_namespace)::getStringAttribute_abi_cxx11_
            (&local_38,(_anonymous_namespace_ *)type,(xmlNodePtr)att_name,in_RCX);
  local_54 = 0;
  local_48 = (type_info_t *)local_38._M_dataplus._M_p;
  local_40 = (type_info_t *)(local_38._M_dataplus._M_p + local_38._M_string_length);
  local_18.start = local_38._M_dataplus._M_p;
  local_18.finish = (char *)local_40;
  bVar2 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::shr_signed<int>
                    (&local_18,&local_54);
  iVar1 = local_54;
  if (bVar2) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    return iVar1;
  }
  local_50 = &PTR__bad_cast_00113a90;
  local_48 = (type_info_t *)&std::__cxx11::string::typeinfo;
  local_40 = (type_info_t *)&int::typeinfo;
  boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_50);
}

Assistant:

T getAttribute(xmlNodePtr type, char const* att_name)
    { return boost::lexical_cast<T>(getStringAttribute(type, att_name)); }